

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind)

{
  bool bVar1;
  
  if ((int)kind < 0x134) {
    if ((int)kind < 0xcc) {
      if (kind == BindDirective) {
        return true;
      }
      if (kind == ConfigDeclaration) {
        return true;
      }
    }
    else if ((kind - ExternModuleDecl < 2) || (kind == InterfaceDeclaration)) {
      return true;
    }
  }
  else if ((int)kind < 0x17c) {
    if (kind == ModuleDeclaration) {
      return true;
    }
    if (kind == PackageDeclaration) {
      return true;
    }
  }
  else {
    if (kind == ProgramDeclaration) {
      return true;
    }
    if (kind == TimeUnitsDeclaration) {
      return true;
    }
    if (kind == UdpDeclaration) {
      return true;
    }
  }
  bVar1 = isAllowedInPackage(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::BindDirective:
        case SyntaxKind::UdpDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
        case SyntaxKind::ConfigDeclaration:
            return true;
        default:
            return isAllowedInPackage(kind);
    }
}